

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

void mpc_delete(mpc_parser_t *p)

{
  if (p->retained != '\0') {
    if (p->type != '\0') {
      mpc_undefine_unretained(p,0);
    }
    free(p->name);
    free(p);
    return;
  }
  mpc_undefine_unretained(p,0);
  return;
}

Assistant:

void mpc_delete(mpc_parser_t *p) {
  if (p->retained) {

    if (p->type != MPC_TYPE_UNDEFINED) {
      mpc_undefine_unretained(p, 0);
    }

    free(p->name);
    free(p);

  } else {
    mpc_undefine_unretained(p, 0);
  }
}